

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_grow_predicted<EasyUseMap<HashObject<256,32>,int>>(int iters)

{
  int in_EDI;
  size_t finish;
  double ut;
  int i;
  size_t start;
  Rusage t;
  EasyUseMap<HashObject<256,_32>,_int> set;
  undefined8 in_stack_fffffffffffffe78;
  HashObject<256,_32> *in_stack_fffffffffffffe80;
  Rusage *in_stack_fffffffffffffe90;
  key_type *in_stack_fffffffffffffeb8;
  map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_fffffffffffffec0;
  size_t in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  double in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  int local_5c;
  EasyUseMap<HashObject<256,_32>,_int> local_38;
  int local_4;
  
  local_4 = in_EDI;
  EasyUseMap<HashObject<256,_32>,_int>::EasyUseMap((EasyUseMap<HashObject<256,_32>,_int> *)0x1e288b)
  ;
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffe80);
  CurrentMemoryUsage();
  EasyUseMap<HashObject<256,_32>,_int>::resize(&local_38,(long)local_4);
  Rusage::Reset((Rusage *)in_stack_fffffffffffffe80);
  for (local_5c = 0; local_5c < local_4; local_5c = local_5c + 1) {
    HashObject<256,_32>::HashObject
              (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    in_stack_fffffffffffffe80 =
         (HashObject<256,_32> *)
         std::
         map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
         ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffe80->i_ = local_5c + 1;
  }
  Rusage::UserTime(in_stack_fffffffffffffe90);
  CurrentMemoryUsage();
  report(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
         in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  EasyUseMap<HashObject<256,_32>,_int>::~EasyUseMap
            ((EasyUseMap<HashObject<256,_32>,_int> *)0x1e29b9);
  return;
}

Assistant:

static void time_map_grow_predicted(int iters) {
  MapType set;
  Rusage t;

  const size_t start = CurrentMemoryUsage();
  set.resize(iters);
  t.Reset();
  for (int i = 0; i < iters; i++) {
    set[i] = i + 1;
  }
  double ut = t.UserTime();
  const size_t finish = CurrentMemoryUsage();
  report("map_predict/grow", ut, iters, start, finish);
}